

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_parameter.hpp
# Opt level: O2

void __thiscall
ruckig::InputParameter<3UL,_ruckig::StandardVector>::~InputParameter
          (InputParameter<3UL,_ruckig::StandardVector> *this)

{
  std::_Optional_payload_base<std::vector<double,_std::allocator<double>_>_>::_M_reset
            ((_Optional_payload_base<std::vector<double,_std::allocator<double>_>_> *)
             &this->per_section_minimum_duration);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
              *)&this->per_section_min_position);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
              *)&this->per_section_max_position);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
              *)&this->per_section_min_acceleration);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
              *)&this->per_section_min_velocity);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
              *)&this->per_section_max_jerk);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
              *)&this->per_section_max_acceleration);
  std::
  _Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
  ::_M_reset((_Optional_payload_base<std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>_>
              *)&this->per_section_max_velocity);
  std::_Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::
  ~_Vector_base(&(this->intermediate_positions).
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
               );
  return;
}

Assistant:

inline static double v_at_a_zero(double v0, double a0, double j) {
        return v0 + (a0 * a0) / (2 * j);
    }